

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void __thiscall CVmConstMapper::prepare_to_store_data(CVmConstMapper *this)

{
  size_t sVar1;
  vm_const_mapper_page **ppvVar2;
  vm_const_mapper_page *pvVar3;
  CVmConstMapper *in_RDI;
  size_t i;
  ulong local_10;
  
  sVar1 = calc_page_count(in_RDI);
  in_RDI->pages_cnt_ = sVar1;
  ppvVar2 = (vm_const_mapper_page **)malloc(in_RDI->pages_cnt_ << 3);
  in_RDI->pages_ = ppvVar2;
  if (in_RDI->pages_ == (vm_const_mapper_page **)0x0) {
    err_throw(0);
  }
  local_10 = 0;
  while( true ) {
    if (in_RDI->pages_cnt_ <= local_10) {
      return;
    }
    pvVar3 = (vm_const_mapper_page *)malloc(in_RDI->page_size_ + 8);
    in_RDI->pages_[local_10] = pvVar3;
    if (in_RDI->pages_[local_10] == (vm_const_mapper_page *)0x0) break;
    in_RDI->pages_[local_10]->max_ofs_used = 0;
    local_10 = local_10 + 1;
  }
  err_throw(0);
}

Assistant:

void CVmConstMapper::prepare_to_store_data()
{
    size_t i;
    
    /* figure out how many pages we need */
    pages_cnt_ = calc_page_count();

    /* allocate space for the list of pages */
    pages_ = (vm_const_mapper_page **)
             t3malloc(pages_cnt_ * sizeof(pages_[0]));
    if (pages_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* allocate each page */
    for (i = 0 ; i < pages_cnt_ ; ++i)
    {
        /* 
         *   allocate this page - allocate the header structure plus space
         *   for the page data 
         */
        pages_[i] = (vm_const_mapper_page *)
                    t3malloc(sizeof(pages_[i]) + page_size_);
        if (pages_[i] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* the page has nothing stored yet */
        pages_[i]->max_ofs_used = 0;
    }
}